

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void gatom_key(void *z,t_symbol *keysym,t_floatarg f)

{
  int iVar1;
  byte bVar2;
  t_atom *ptVar3;
  _rtext *x;
  t_symbol *ptVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int keynum;
  double dVar8;
  int bufsize;
  char *buf;
  int local_3c;
  char *local_38;
  
  keynum = (int)f;
  ptVar3 = gatom_getatom((t_gatom *)z);
  x = glist_findrtext(*(_glist **)((long)z + 0x38),(t_text *)z);
  if (keynum == 10) {
    *(byte *)((long)z + 0x78) = *(byte *)((long)z + 0x78) & 0xef;
    if (x == *(_rtext **)(*(long *)(*(long *)((long)z + 0x38) + 0xc0) + 0x28)) {
      rtext_gettext(x,&local_38,&local_3c);
      ptVar4 = gensym("End");
      lVar6 = 0;
      rtext_key(x,0,ptVar4);
      do {
        if (local_38[local_3c + -1 + (int)lVar6] != '.') {
          if (lVar6 == 0) goto LAB_0015e7a8;
          uVar7 = -lVar6;
          goto LAB_0015e794;
        }
        lVar6 = lVar6 + -1;
      } while (lVar6 != -3);
      uVar7 = 3;
LAB_0015e794:
      do {
        rtext_key(x,8,&s_);
        uVar5 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar5;
      } while (uVar5 != 0);
LAB_0015e7a8:
      rtext_gettext(x,&local_38,&local_3c);
      if (*(int *)((long)z + 0x30) == 2) {
        ptVar4 = gensym(local_38);
        (ptVar3->a_w).w_symbol = ptVar4;
      }
      else if (*(int *)((long)z + 0x30) == 1) {
        dVar8 = atof(local_38);
        (ptVar3->a_w).w_float = (float)dVar8;
      }
      else {
        text_setto((t_text *)z,*(_glist **)((long)z + 0x38),local_38,local_3c);
      }
      rtext_activate(x,0);
    }
    gatom_bang((t_gatom *)z);
    gatom_senditup((t_gatom *)z);
  }
  else if ((keynum == 0) && (bVar2 = *(byte *)((long)z + 0x78), (bVar2 & 0x10) == 0)) {
    if (x == *(_rtext **)(*(long *)(*(long *)((long)z + 0x38) + 0xc0) + 0x28)) {
      rtext_activate(x,0);
      bVar2 = *(byte *)((long)z + 0x78);
    }
    *(byte *)((long)z + 0x78) = bVar2 & 0xf7;
    gatom_reborder((t_gatom *)z);
    if ((*(_glist **)((long)z + 0x38))->gl_editor != (t_editor *)0x0) {
      glist_retext(*(_glist **)((long)z + 0x38),(t_text *)z);
      return;
    }
  }
  else {
    if (x != *(_rtext **)(*(long *)(*(long *)((long)z + 0x38) + 0xc0) + 0x28)) {
      rtext_activate(x,1);
      rtext_key(x,0x2e,&s_);
      rtext_key(x,0x2e,&s_);
      rtext_key(x,0x2e,&s_);
      ptVar4 = gensym("Home");
      rtext_key(x,0,ptVar4);
    }
    iVar1 = *(int *)((long)z + 0x30);
    if (iVar1 == 2) {
LAB_0015e769:
      rtext_key(x,keynum,keysym);
      return;
    }
    if (iVar1 == 1) {
      if ((keynum - 0x30U < 10) ||
         (((keynum - 0x2bU < 0x3b &&
           ((0x40000000400000dU >> ((ulong)(keynum - 0x2bU) & 0x3f) & 1) != 0)) || (keynum == 8))))
      goto LAB_0015e769;
    }
    else if (iVar1 == 0) goto LAB_0015e769;
  }
  return;
}

Assistant:

void gatom_key(void *z, t_symbol *keysym, t_floatarg f)
{
    t_gatom *x = (t_gatom *)z;
    int c = f, bufsize, i;
    char *buf;
    t_atom *ap = gatom_getatom(x);

    t_rtext *t = glist_findrtext(x->a_glist, &x->a_text);
    if (c == 0 && !x->a_doubleclicked)
    {
        /* we're being notified that no more keys will come for this grab */
        if (t == x->a_glist->gl_editor->e_textedfor)
            rtext_activate(t, 0);
        x->a_grabbed = 0;
        gatom_reborder(x);
        gatom_redraw(&x->a_text.te_g, x->a_glist);
    }
    else if (c == '\n')
    {
        x->a_doubleclicked = 0;
        if (t == x->a_glist->gl_editor->e_textedfor)
        {
            rtext_gettext(t, &buf, &bufsize);
            rtext_key(t, 0, gensym("End"));
            for (i = 0; i < 3; i++)
                if (buf[bufsize-i-1] != '.')
                    break;
            while (i--)
                rtext_key(t, '\b', &s_);
            rtext_gettext(t, &buf, &bufsize);
            if (x->a_flavor == A_FLOAT)
                ap->a_w.w_float = atof(buf);
            else if (x->a_flavor == A_SYMBOL)
                ap->a_w.w_symbol = gensym(buf);
            else
                text_setto(&x->a_text, x->a_glist, buf, bufsize);
            rtext_activate(t, 0);
        }
        gatom_bang(x);
        gatom_senditup(x);
    }
    else
    {
        if (t != x->a_glist->gl_editor->e_textedfor)
        {
            rtext_activate(t, 1);
            rtext_key(t, '.', &s_);
            rtext_key(t, '.', &s_);
            rtext_key(t, '.', &s_);
            rtext_key(t, 0, gensym("Home"));
        }
        if (x->a_flavor == A_SYMBOL || x->a_flavor == A_LIST)
            rtext_key(t, c, keysym);  /* insert the character */
        else if (x->a_flavor == A_FLOAT && ((c >= '0' && c <= '9') || c == '.' ||
            c == '-' || c == '+' || c == 'e' || c == 'E' || c == '\b'))
                rtext_key(t, c, keysym);  /* insert the accepted characters */
    }
}